

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_image.c
# Opt level: O0

int aom_img_add_metadata
              (aom_image_t *img,uint32_t type,uint8_t *data,size_t sz,
              aom_metadata_insert_flags_t insert_flag)

{
  aom_metadata_array_t *paVar1;
  aom_metadata_t *paVar2;
  void *pvVar3;
  undefined8 in_RCX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  aom_metadata_t **metadata_array;
  aom_metadata_t *metadata;
  size_t in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  aom_metadata_insert_flags_t insert_flag_00;
  size_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint32_t type_00;
  int local_4;
  
  type_00 = (uint32_t)((ulong)in_RCX >> 0x20);
  insert_flag_00 = (aom_metadata_insert_flags_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  if (in_RDI == 0) {
    local_4 = -1;
  }
  else {
    if (*(long *)(in_RDI + 0x98) == 0) {
      paVar1 = aom_img_metadata_array_alloc(in_stack_ffffffffffffffb8);
      *(aom_metadata_array_t **)(in_RDI + 0x98) = paVar1;
      if (*(long *)(in_RDI + 0x98) == 0) {
        return -1;
      }
    }
    if (((in_R8D & 0x10) == 0) || ((in_ESI != 3 && (in_ESI != 5)))) {
      paVar2 = aom_img_metadata_alloc
                         (type_00,(uint8_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffc8,insert_flag_00);
      if (paVar2 == (aom_metadata_t *)0x0) {
        local_4 = -1;
      }
      else {
        pvVar3 = realloc(*(void **)(*(long *)(in_RDI + 0x98) + 8),
                         (**(long **)(in_RDI + 0x98) + 1) * 8);
        if (pvVar3 == (void *)0x0) {
          aom_img_metadata_free((aom_metadata_t *)0x18d591);
          local_4 = -1;
        }
        else {
          *(void **)(*(long *)(in_RDI + 0x98) + 8) = pvVar3;
          *(aom_metadata_t **)
           (*(long *)(*(long *)(in_RDI + 0x98) + 8) + **(long **)(in_RDI + 0x98) * 8) = paVar2;
          **(long **)(in_RDI + 0x98) = **(long **)(in_RDI + 0x98) + 1;
          local_4 = 0;
        }
      }
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int aom_img_add_metadata(aom_image_t *img, uint32_t type, const uint8_t *data,
                         size_t sz, aom_metadata_insert_flags_t insert_flag) {
  if (!img) return -1;
  if (!img->metadata) {
    img->metadata = aom_img_metadata_array_alloc(0);
    if (!img->metadata) return -1;
  }
  // Some metadata types are not allowed to be layer specific, according to
  // the Table in Section 6.7.1 of the AV1 specifiction.
  // Do not check for OBU_METADATA_TYPE_HDR_CLL or OBU_METADATA_TYPE_HDR_MDCV
  // because there are plans to alow them to be layer specific.
  if ((insert_flag & AOM_MIF_LAYER_SPECIFIC) &&
      (type == OBU_METADATA_TYPE_SCALABILITY ||
       type == OBU_METADATA_TYPE_TIMECODE)) {
    return -1;
  }
  aom_metadata_t *metadata =
      aom_img_metadata_alloc(type, data, sz, insert_flag);
  if (!metadata) return -1;
  aom_metadata_t **metadata_array =
      (aom_metadata_t **)realloc(img->metadata->metadata_array,
                                 (img->metadata->sz + 1) * sizeof(metadata));
  if (!metadata_array) {
    aom_img_metadata_free(metadata);
    return -1;
  }
  img->metadata->metadata_array = metadata_array;
  img->metadata->metadata_array[img->metadata->sz] = metadata;
  img->metadata->sz++;
  return 0;
}